

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O2

void __thiscall fasttext::Meter::writeGeneralMetrics(Meter *this,ostream *out,int32_t k)

{
  uint64_t uVar1;
  ostream *poVar2;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var_00 [56];
  undefined1 in_XMM2 [16];
  undefined1 auVar4 [64];
  undefined1 auVar3 [16];
  undefined1 auVar6 [64];
  undefined1 auVar5 [16];
  
  poVar2 = std::operator<<(out,"N");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 3;
  poVar2 = std::operator<<(out,"P@");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,k);
  auVar6._8_56_ = extraout_var_00;
  auVar6._0_8_ = extraout_XMM1_Qa;
  auVar5 = auVar6._0_16_;
  auVar4._8_56_ = extraout_var;
  auVar4._0_8_ = extraout_XMM0_Qa;
  auVar3 = auVar4._0_16_;
  std::operator<<(poVar2,"\t");
  uVar1 = (this->metrics_).predicted;
  auVar3 = vcvtusi2sd_avx512f(auVar3,(this->metrics_).predictedGold);
  auVar5 = vcvtusi2sd_avx512f(auVar5,uVar1);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((ulong)(uVar1 == 0) * 0x7ff8000000000000 +
                              (ulong)(uVar1 != 0) * (long)(auVar3._0_8_ / auVar5._0_8_)));
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"R@");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,k);
  std::operator<<(poVar2,"\t");
  uVar1 = (this->metrics_).gold;
  auVar3 = vcvtusi2sd_avx512f(in_XMM2,(this->metrics_).predictedGold);
  auVar5 = vcvtusi2sd_avx512f(in_XMM2,uVar1);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((ulong)(uVar1 == 0) * 0x7ff8000000000000 +
                              (ulong)(uVar1 != 0) * (long)(auVar3._0_8_ / auVar5._0_8_)));
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Meter::writeGeneralMetrics(std::ostream& out, int32_t k) const {
  out << "N"
      << "\t" << nexamples_ << std::endl;
  out << std::setprecision(3);
  out << "P@" << k << "\t" << metrics_.precision() << std::endl;
  out << "R@" << k << "\t" << metrics_.recall() << std::endl;
}